

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_scan_serverhello_tlsext(SSL_HANDSHAKE *hs,CBS *cbs,int *out_alert)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  byte local_71;
  ulong uStack_70;
  uint8_t alert_1;
  size_t i;
  tls_extension *ptStack_60;
  uint8_t alert;
  tls_extension *ext;
  undefined1 local_50 [4];
  uint ext_index;
  CBS extension;
  undefined1 auStack_38 [2];
  uint16_t type;
  uint32_t received;
  CBS extensions;
  int *out_alert_local;
  CBS *cbs_local;
  SSL_HANDSHAKE *hs_local;
  
  _auStack_38 = cbs->data;
  extensions.data = (uint8_t *)cbs->len;
  extensions.len = (size_t)out_alert;
  bVar1 = tls1_check_duplicate_extensions((CBS *)auStack_38);
  if (bVar1) {
    extension.len._4_4_ = 0;
    do {
      sVar3 = CBS_len((CBS *)auStack_38);
      if (sVar3 == 0) {
        uStack_70 = 0;
        do {
          if (0x1b < uStack_70) {
            return true;
          }
          if ((extension.len._4_4_ & 1 << ((byte)uStack_70 & 0x1f)) == 0) {
            local_71 = 0x32;
            uVar4 = (**(code **)(kExtensions + uStack_70 * 0x28 + 0x10))(hs,&local_71,0);
            if ((uVar4 & 1) == 0) {
              ERR_put_error(0x10,0,0xa4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                            ,0x1044);
              ERR_add_error_dataf("extension %u",(ulong)*(ushort *)(kExtensions + uStack_70 * 0x28))
              ;
              *(uint *)extensions.len = (uint)local_71;
              return false;
            }
          }
          uStack_70 = uStack_70 + 1;
        } while( true );
      }
      iVar2 = CBS_get_u16((CBS *)auStack_38,(uint16_t *)((long)&extension.len + 2));
      if ((iVar2 == 0) ||
         (iVar2 = CBS_get_u16_length_prefixed((CBS *)auStack_38,(CBS *)local_50), iVar2 == 0)) {
        *(undefined4 *)extensions.len = 0x32;
        return false;
      }
      ptStack_60 = tls_extension_find((uint32_t *)((long)&ext + 4),extension.len._2_2_);
      if (ptStack_60 == (tls_extension *)0x0) {
        ERR_put_error(0x10,0,0xde,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x1022);
        ERR_add_error_dataf("extension %u",(ulong)extension.len._2_2_);
        *(undefined4 *)extensions.len = 0x6e;
        return false;
      }
      if (((hs->extensions).sent & 1 << ((byte)ext._4_4_ & 0x1f)) == 0) {
        ERR_put_error(0x10,0,0xde,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x102d);
        ERR_add_error_dataf("extension %u",(ulong)extension.len._2_2_);
        *(undefined4 *)extensions.len = 0x6e;
        return false;
      }
      extension.len._4_4_ = 1 << ((byte)ext._4_4_ & 0x1f) | extension.len._4_4_;
      i._7_1_ = 0x32;
      bVar1 = (*ptStack_60->parse_serverhello)(hs,(uint8_t *)((long)&i + 7),(CBS *)local_50);
    } while (bVar1);
    ERR_put_error(0x10,0,0x95,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x1037);
    ERR_add_error_dataf("extension %u",(ulong)extension.len._2_2_);
    *(uint *)extensions.len = (uint)i._7_1_;
  }
  else {
    *(undefined4 *)extensions.len = 0x32;
  }
  return false;
}

Assistant:

static bool ssl_scan_serverhello_tlsext(SSL_HANDSHAKE *hs, const CBS *cbs,
                                        int *out_alert) {
  CBS extensions = *cbs;
  if (!tls1_check_duplicate_extensions(&extensions)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  uint32_t received = 0;
  while (CBS_len(&extensions) != 0) {
    uint16_t type;
    CBS extension;

    // Decode the next extension.
    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    unsigned ext_index;
    const struct tls_extension *const ext =
        tls_extension_find(&ext_index, type);

    if (ext == NULL) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)type);
      *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
      return false;
    }

    static_assert(kNumExtensions <= sizeof(hs->extensions.sent) * 8,
                  "too many bits");

    if (!(hs->extensions.sent & (1u << ext_index))) {
      // If the extension was never sent then it is illegal.
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)type);
      *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
      return false;
    }

    received |= (1u << ext_index);

    uint8_t alert = SSL_AD_DECODE_ERROR;
    if (!ext->parse_serverhello(hs, &alert, &extension)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_ERROR_PARSING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)type);
      *out_alert = alert;
      return false;
    }
  }

  for (size_t i = 0; i < kNumExtensions; i++) {
    if (!(received & (1u << i))) {
      // Extension wasn't observed so call the callback with a NULL
      // parameter.
      uint8_t alert = SSL_AD_DECODE_ERROR;
      if (!kExtensions[i].parse_serverhello(hs, &alert, NULL)) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_MISSING_EXTENSION);
        ERR_add_error_dataf("extension %u", (unsigned)kExtensions[i].value);
        *out_alert = alert;
        return false;
      }
    }
  }

  return true;
}